

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void write_pic_parameter_set_rbsp(h264_stream_t *h,bs_t *b)

{
  pps_t *ppVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  int *useDefaultScalingMatrixFlag;
  uint uVar5;
  ulong uVar6;
  uint32_t uVar7;
  int (*scalingList) [16];
  int (*paiVar8) [16];
  int (*paiVar9) [16];
  long lVar10;
  int *piVar11;
  bool bVar12;
  
  ppVar1 = h->pps;
  bs_write_ue(b,ppVar1->pic_parameter_set_id);
  bs_write_ue(b,ppVar1->seq_parameter_set_id);
  uVar3 = ppVar1->entropy_coding_mode_flag;
  iVar4 = b->bits_left + -1;
  b->bits_left = iVar4;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
    *b->p = *b->p | (byte)((uVar3 & 1) << ((byte)b->bits_left & 0x1f));
  }
  if (b->bits_left == 0) {
    b->p = b->p + 1;
    b->bits_left = 8;
  }
  uVar3 = ppVar1->pic_order_present_flag;
  iVar4 = b->bits_left + -1;
  b->bits_left = iVar4;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
    *b->p = *b->p | (byte)((uVar3 & 1) << ((byte)b->bits_left & 0x1f));
  }
  if (b->bits_left == 0) {
    b->p = b->p + 1;
    b->bits_left = 8;
  }
  bs_write_ue(b,ppVar1->num_slice_groups_minus1);
  if (0 < ppVar1->num_slice_groups_minus1) {
    bs_write_ue(b,ppVar1->slice_group_map_type);
    switch(ppVar1->slice_group_map_type) {
    case 0:
      if (-1 < ppVar1->num_slice_groups_minus1) {
        lVar10 = -1;
        do {
          bs_write_ue(b,ppVar1->run_length_minus1[lVar10 + 1]);
          lVar10 = lVar10 + 1;
        } while (lVar10 < ppVar1->num_slice_groups_minus1);
      }
      break;
    case 2:
      if (0 < ppVar1->num_slice_groups_minus1) {
        lVar10 = 0;
        do {
          bs_write_ue(b,ppVar1->top_left[lVar10]);
          bs_write_ue(b,ppVar1->bottom_right[lVar10]);
          lVar10 = lVar10 + 1;
        } while (lVar10 < ppVar1->num_slice_groups_minus1);
      }
      break;
    case 3:
    case 4:
    case 5:
      uVar3 = ppVar1->slice_group_change_direction_flag;
      iVar4 = b->bits_left + -1;
      b->bits_left = iVar4;
      pbVar2 = b->p;
      if (pbVar2 < b->end) {
        *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
        *b->p = *b->p | (byte)((uVar3 & 1) << ((byte)b->bits_left & 0x1f));
      }
      if (b->bits_left == 0) {
        b->p = b->p + 1;
        b->bits_left = 8;
      }
      bs_write_ue(b,ppVar1->slice_group_change_rate_minus1);
      break;
    case 6:
      bs_write_ue(b,ppVar1->pic_size_in_map_units_minus1);
      if (-1 < ppVar1->pic_size_in_map_units_minus1) {
        lVar10 = 0;
        do {
          iVar4 = ppVar1->num_slice_groups_minus1;
          if (iVar4 < 0) {
            iVar4 = -1;
          }
          uVar3 = 0xffffffff;
          do {
            uVar5 = uVar3;
            uVar3 = uVar5 + 1;
          } while (iVar4 + 1U >> ((byte)uVar3 & 0x1f) != 0);
          if (iVar4 + 1U != 1 << ((byte)uVar5 & 0x1f)) {
            uVar5 = uVar3;
          }
          if (uVar3 == 0) {
            uVar5 = 0;
          }
          if (0 < (int)uVar5) {
            uVar3 = ppVar1->slice_group_id[lVar10];
            do {
              uVar5 = uVar5 - 1;
              iVar4 = b->bits_left + -1;
              b->bits_left = iVar4;
              pbVar2 = b->p;
              if (pbVar2 < b->end) {
                *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
                *b->p = *b->p | ((uVar3 >> (uVar5 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
              }
              if (b->bits_left == 0) {
                b->p = b->p + 1;
                b->bits_left = 8;
              }
            } while (uVar5 != 0);
          }
          bVar12 = lVar10 < ppVar1->pic_size_in_map_units_minus1;
          lVar10 = lVar10 + 1;
        } while (bVar12);
      }
    }
  }
  bs_write_ue(b,ppVar1->num_ref_idx_l0_active_minus1);
  bs_write_ue(b,ppVar1->num_ref_idx_l1_active_minus1);
  uVar3 = ppVar1->weighted_pred_flag;
  iVar4 = b->bits_left + -1;
  b->bits_left = iVar4;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
    *b->p = *b->p | (byte)((uVar3 & 1) << ((byte)b->bits_left & 0x1f));
  }
  if (b->bits_left == 0) {
    b->p = b->p + 1;
    b->bits_left = 8;
  }
  uVar3 = ppVar1->weighted_bipred_idc;
  uVar5 = 1;
  do {
    iVar4 = b->bits_left + -1;
    b->bits_left = iVar4;
    pbVar2 = b->p;
    if (pbVar2 < b->end) {
      *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
      *b->p = *b->p | ((uVar3 >> (uVar5 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    bVar12 = uVar5 != 0;
    uVar5 = uVar5 - 1;
  } while (bVar12);
  iVar4 = ppVar1->pic_init_qp_minus26;
  uVar7 = iVar4 * 2 - 1;
  if (iVar4 < 1) {
    uVar7 = iVar4 * -2;
  }
  bs_write_ue(b,uVar7);
  iVar4 = ppVar1->pic_init_qs_minus26;
  uVar7 = iVar4 * 2 - 1;
  if (iVar4 < 1) {
    uVar7 = iVar4 * -2;
  }
  bs_write_ue(b,uVar7);
  iVar4 = ppVar1->chroma_qp_index_offset;
  uVar7 = iVar4 * 2 - 1;
  if (iVar4 < 1) {
    uVar7 = iVar4 * -2;
  }
  bs_write_ue(b,uVar7);
  uVar3 = ppVar1->deblocking_filter_control_present_flag;
  iVar4 = b->bits_left + -1;
  b->bits_left = iVar4;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
    *b->p = *b->p | (byte)((uVar3 & 1) << ((byte)b->bits_left & 0x1f));
  }
  if (b->bits_left == 0) {
    b->p = b->p + 1;
    b->bits_left = 8;
  }
  uVar3 = ppVar1->constrained_intra_pred_flag;
  iVar4 = b->bits_left + -1;
  b->bits_left = iVar4;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
    *b->p = *b->p | (byte)((uVar3 & 1) << ((byte)b->bits_left & 0x1f));
  }
  if (b->bits_left == 0) {
    b->p = b->p + 1;
    b->bits_left = 8;
  }
  uVar3 = ppVar1->redundant_pic_cnt_present_flag;
  iVar4 = b->bits_left + -1;
  b->bits_left = iVar4;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
    *b->p = *b->p | (byte)((uVar3 & 1) << ((byte)b->bits_left & 0x1f));
  }
  if (b->bits_left == 0) {
    b->p = b->p + 1;
    b->bits_left = 8;
  }
  uVar3 = ppVar1->transform_8x8_mode_flag;
  if ((ppVar1->second_chroma_qp_index_offset != 0 || ppVar1->pic_scaling_matrix_present_flag != 0)
      || uVar3 != 0) {
    iVar4 = b->bits_left + -1;
    b->bits_left = iVar4;
    pbVar2 = b->p;
    if (pbVar2 < b->end) {
      *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
      *b->p = *b->p | (byte)((uVar3 & 1) << ((byte)b->bits_left & 0x1f));
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    uVar3 = ppVar1->pic_scaling_matrix_present_flag;
    iVar4 = b->bits_left + -1;
    b->bits_left = iVar4;
    pbVar2 = b->p;
    if (pbVar2 < b->end) {
      *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
      *b->p = *b->p | (byte)((uVar3 & 1) << ((byte)b->bits_left & 0x1f));
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    if ((ppVar1->pic_scaling_matrix_present_flag != 0) && (-3 < ppVar1->transform_8x8_mode_flag)) {
      paiVar9 = ppVar1->ScalingList4x4;
      piVar11 = ppVar1->ScalingList8x8[1] + 0x3a;
      paiVar8 = (int (*) [16])(ppVar1->bottom_right + 6);
      uVar6 = 0xffffffffffffffff;
      do {
        uVar3 = piVar11[-0xe8];
        iVar4 = b->bits_left + -1;
        b->bits_left = iVar4;
        pbVar2 = b->p;
        if (pbVar2 < b->end) {
          *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
          *b->p = *b->p | (byte)((uVar3 & 1) << ((byte)b->bits_left & 0x1f));
        }
        if (b->bits_left == 0) {
          b->p = b->p + 1;
          b->bits_left = 8;
        }
        uVar6 = uVar6 + 1;
        if (piVar11[-0xe8] != 0) {
          if (uVar6 < 6) {
            iVar4 = 0x10;
            useDefaultScalingMatrixFlag = piVar11 + -0x80;
            scalingList = paiVar9;
          }
          else {
            iVar4 = 0x40;
            useDefaultScalingMatrixFlag = piVar11;
            scalingList = paiVar8;
          }
          write_scaling_list(b,*scalingList,iVar4,useDefaultScalingMatrixFlag);
        }
        piVar11 = piVar11 + 1;
        paiVar9 = paiVar9 + 1;
        paiVar8 = paiVar8 + 4;
      } while ((long)uVar6 < (long)ppVar1->transform_8x8_mode_flag * 2 + 5);
    }
    iVar4 = ppVar1->second_chroma_qp_index_offset;
    uVar7 = iVar4 * 2 - 1;
    if (iVar4 < 1) {
      uVar7 = iVar4 * -2;
    }
    bs_write_ue(b,uVar7);
    return;
  }
  return;
}

Assistant:

void write_pic_parameter_set_rbsp(h264_stream_t* h, bs_t* b)
{
    pps_t* pps = h->pps;
    if( 0 )
    {
        memset(pps, 0, sizeof(pps_t));
    }

    bs_write_ue(b, pps->pic_parameter_set_id);
    bs_write_ue(b, pps->seq_parameter_set_id);
    bs_write_u1(b, pps->entropy_coding_mode_flag);
    bs_write_u1(b, pps->pic_order_present_flag);
    bs_write_ue(b, pps->num_slice_groups_minus1);

    if( pps->num_slice_groups_minus1 > 0 )
    {
        bs_write_ue(b, pps->slice_group_map_type);
        if( pps->slice_group_map_type == 0 )
        {
            for( int i_group = 0; i_group <= pps->num_slice_groups_minus1; i_group++ )
            {
                bs_write_ue(b, pps->run_length_minus1[ i_group ]);
            }
        }
        else if( pps->slice_group_map_type == 2 )
        {
            for( int i_group = 0; i_group < pps->num_slice_groups_minus1; i_group++ )
            {
                bs_write_ue(b, pps->top_left[ i_group ]);
                bs_write_ue(b, pps->bottom_right[ i_group ]);
            }
        }
        else if( pps->slice_group_map_type == 3 ||
                 pps->slice_group_map_type == 4 ||
                 pps->slice_group_map_type == 5 )
        {
            bs_write_u1(b, pps->slice_group_change_direction_flag);
            bs_write_ue(b, pps->slice_group_change_rate_minus1);
        }
        else if( pps->slice_group_map_type == 6 )
        {
            bs_write_ue(b, pps->pic_size_in_map_units_minus1);
            for( int i = 0; i <= pps->pic_size_in_map_units_minus1; i++ )
            {
                int v = intlog2( pps->num_slice_groups_minus1 + 1 );
                bs_write_u(b, v, pps->slice_group_id[ i ]);
            }
        }
    }
    bs_write_ue(b, pps->num_ref_idx_l0_active_minus1);
    bs_write_ue(b, pps->num_ref_idx_l1_active_minus1);
    bs_write_u1(b, pps->weighted_pred_flag);
    bs_write_u(b, 2, pps->weighted_bipred_idc);
    bs_write_se(b, pps->pic_init_qp_minus26);
    bs_write_se(b, pps->pic_init_qs_minus26);
    bs_write_se(b, pps->chroma_qp_index_offset);
    bs_write_u1(b, pps->deblocking_filter_control_present_flag);
    bs_write_u1(b, pps->constrained_intra_pred_flag);
    bs_write_u1(b, pps->redundant_pic_cnt_present_flag);

    int have_more_data = 0;
    if( 0 ) { have_more_data = more_rbsp_data(b); }
    if( 1 )
    {
        have_more_data = pps->transform_8x8_mode_flag | pps->pic_scaling_matrix_present_flag | pps->second_chroma_qp_index_offset != 0;
    }

    if( have_more_data )
    {
        bs_write_u1(b, pps->transform_8x8_mode_flag);
        bs_write_u1(b, pps->pic_scaling_matrix_present_flag);
        if( pps->pic_scaling_matrix_present_flag )
        {
            for( int i = 0; i < 6 + 2* pps->transform_8x8_mode_flag; i++ )
            {
                bs_write_u1(b, pps->pic_scaling_list_present_flag[ i ]);
                if( pps->pic_scaling_list_present_flag[ i ] )
                {
                    if( i < 6 )
                    {
                        write_scaling_list( b, pps->ScalingList4x4[ i ], 16,
                                                 &( pps->UseDefaultScalingMatrix4x4Flag[ i ] ) );
                    }
                    else
                    {
                        write_scaling_list( b, pps->ScalingList8x8[ i - 6 ], 64,
                                                 &( pps->UseDefaultScalingMatrix8x8Flag[ i - 6 ] ) );
                    }
                }
            }
        }
        bs_write_se(b, pps->second_chroma_qp_index_offset);
    }

    if( 0 )
    {
        memcpy(h->pps_table[pps->pic_parameter_set_id], h->pps, sizeof(pps_t));
    }
}